

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_IHDR(png_const_structrp png_ptr,png_const_inforp info_ptr,png_uint_32 *width,
            png_uint_32 *height,int *bit_depth,int *color_type,int *interlace_type,
            int *compression_type,int *filter_type)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if (info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    if (width != (png_uint_32 *)0x0) {
      *width = info_ptr->width;
    }
    if (height != (png_uint_32 *)0x0) {
      *height = info_ptr->height;
    }
    if (bit_depth != (int *)0x0) {
      *bit_depth = (uint)info_ptr->bit_depth;
    }
    if (color_type != (int *)0x0) {
      *color_type = (uint)info_ptr->color_type;
    }
    if (compression_type != (int *)0x0) {
      *compression_type = (uint)info_ptr->compression_type;
    }
    if (filter_type != (int *)0x0) {
      *filter_type = (uint)info_ptr->filter_type;
    }
    if (interlace_type != (int *)0x0) {
      *interlace_type = (uint)info_ptr->interlace_type;
    }
    png_check_IHDR(png_ptr,info_ptr->width,info_ptr->height,(uint)info_ptr->bit_depth,
                   (uint)info_ptr->color_type,(uint)info_ptr->interlace_type,
                   (uint)info_ptr->compression_type,(uint)info_ptr->filter_type);
    pVar1 = 1;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_IHDR(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_uint_32 *width, png_uint_32 *height, int *bit_depth,
    int *color_type, int *interlace_type, int *compression_type,
    int *filter_type)
{
   png_debug1(1, "in %s retrieval function", "IHDR");

   if (png_ptr == NULL || info_ptr == NULL)
      return 0;

   if (width != NULL)
       *width = info_ptr->width;

   if (height != NULL)
       *height = info_ptr->height;

   if (bit_depth != NULL)
       *bit_depth = info_ptr->bit_depth;

   if (color_type != NULL)
       *color_type = info_ptr->color_type;

   if (compression_type != NULL)
      *compression_type = info_ptr->compression_type;

   if (filter_type != NULL)
      *filter_type = info_ptr->filter_type;

   if (interlace_type != NULL)
      *interlace_type = info_ptr->interlace_type;

   /* This is redundant if we can be sure that the info_ptr values were all
    * assigned in png_set_IHDR().  We do the check anyhow in case an
    * application has ignored our advice not to mess with the members
    * of info_ptr directly.
    */
   png_check_IHDR(png_ptr, info_ptr->width, info_ptr->height,
       info_ptr->bit_depth, info_ptr->color_type, info_ptr->interlace_type,
       info_ptr->compression_type, info_ptr->filter_type);

   return 1;
}